

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O1

void anon_unknown.dwarf_26f49c9::WriteGenexEvaluatorArgument
               (ostream *os,string_view *keyword,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *genexes,string *config,cmLocalGenerator *lg,cmScriptGeneratorIndent indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  ostream *poVar4;
  cmScriptGeneratorIndent cVar5;
  WrapQuotes wrapQuotes;
  pointer pbVar6;
  string_view str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  char local_d0;
  string local_c8;
  string_view *local_a8;
  pointer local_a0;
  string local_98;
  cmLocalGenerator *local_78;
  string result;
  string local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  local_a8 = keyword;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + config->_M_string_length);
  pbVar6 = (genexes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (genexes->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_78 = lg;
  if (pbVar6 != local_a0) {
    paVar1 = &local_c8.field_2;
    bVar3 = true;
    do {
      pcVar2 = (pbVar6->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar6->_M_string_length);
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      cmGeneratorExpression::Evaluate
                (&result,&local_50,local_78,&local_98,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (result._M_string_length == 0) {
        local_d0 = '\0';
      }
      else {
        str._M_str = (char *)0x0;
        str._M_len = (size_t)result._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_c8,(cmOutputConverter *)result._M_string_length,str,wrapQuotes);
        local_f0 = &local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == paVar1) {
          local_e0._8_8_ = local_c8.field_2._8_8_;
        }
        else {
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8._M_dataplus._M_p;
        }
        local_e0._M_allocated_capacity._1_7_ = local_c8.field_2._M_allocated_capacity._1_7_;
        local_e0._M_local_buf[0] = local_c8.field_2._M_local_buf[0];
        local_e8 = local_c8._M_string_length;
        local_d0 = '\x01';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 == '\x01') {
        if (bVar3) {
          cVar5.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              cVar5.Level = cVar5.Level + -1;
            } while (cVar5.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,local_a8->_M_str,local_a8->_M_len);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          bVar3 = false;
        }
        cVar5.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            cVar5.Level = cVar5.Level + -1;
          } while (cVar5.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_f0->_M_local_buf,local_e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      if ((local_d0 == '\x01') && (local_d0 = '\0', local_f0 != &local_e0)) {
        operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteGenexEvaluatorArgument(std::ostream& os,
                                 const cm::string_view& keyword,
                                 const std::vector<std::string>& genexes,
                                 const std::string& config,
                                 cmLocalGenerator* lg,
                                 cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, genexes, indent,
    [config, lg](const std::string& genex) -> cm::optional<std::string> {
      std::string result = cmGeneratorExpression::Evaluate(genex, lg, config);
      if (result.empty()) {
        return cm::nullopt;
      }
      return cmOutputConverter::EscapeForCMake(result);
    });
}